

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O3

void __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::solveFullBranchingProblemAndUpdateLabels
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  pointer pEVar1;
  void *__dest;
  size_t __n;
  size_t sVar2;
  ulong uVar3;
  double dVar4;
  BranchingOptimizer branchingOptimizer;
  HungarianBranching<lineage::heuristics::PartitionGraph> local_68;
  
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::HungarianBranching
            (&local_68,&this->partitionGraph_);
  dVar4 = branching::HungarianBranching<lineage::heuristics::PartitionGraph>::optimize(&local_68);
  this->branchingObjective_ = dVar4;
  this_00 = &(this->partitionGraph_).branchingLabels_;
  pEVar1 = (this->partitionGraph_).super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.
           edges_.
           super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->partitionGraph_).branchingLabels_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (this->partitionGraph_).branchingLabels_.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  *(uint *)((long)&(this->partitionGraph_).branchingLabels_.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  std::vector<bool,_std::allocator<bool>_>::reserve
            (this_00,(long)pEVar1 -
                     (long)(this->partitionGraph_).
                           super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>.edges_.
                           super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  uVar3 = (long)local_68.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    __dest = (void *)0x0;
    __n = 0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = operator_new(uVar3);
    __n = (long)local_68.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
  }
  if (local_68.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_68.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    memmove(__dest,local_68.solution_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
    sVar2 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::push_back
                (this_00,*(char *)((long)__dest + sVar2) != '\0');
      sVar2 = sVar2 + 1;
    } while (__n != sVar2);
  }
  if (__dest != (void *)0x0) {
    operator_delete(__dest,uVar3);
  }
  local_68.super_BranchingOptimizer<lineage::heuristics::PartitionGraph>._vptr_BranchingOptimizer =
       (_func_int **)&PTR_optimize_0014c8d8;
  if (local_68.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.solution_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.solution_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.solution_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_68.partitions_);
  return;
}

Assistant:

inline void
PartitionOptimizerBase<BROPT>::solveFullBranchingProblemAndUpdateLabels()
{
    auto branchingOptimizer = BranchingOptimizer(partitionGraph_);
    branchingObjective_ = branchingOptimizer.optimize();

    partitionGraph_.branchingLabels_.clear();
    partitionGraph_.branchingLabels_.reserve(partitionGraph_.numberOfEdges());

    for (auto&& label : branchingOptimizer.getSolution()) {
        partitionGraph_.branchingLabels_.emplace_back(label);
    }
}